

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordered_set_partition_iterator.h
# Opt level: O1

void __thiscall
Gudhi::coxeter_triangulation::Ordered_set_partition_iterator::increment
          (Ordered_set_partition_iterator *this)

{
  Permutation_iterator *this_00;
  
  this_00 = &(this->value_).p_it_;
  if ((this->value_).p_it_.optim_3_ == true) {
    Permutation_iterator::elementary_increment_optim_3(this_00);
  }
  else {
    Permutation_iterator::elementary_increment(this_00);
  }
  if (((this->value_).p_it_.is_end_ == true) && (((this->p_end_).is_end_ & 1U) != 0)) {
    Set_partition_iterator::increment(&(this->value_).s_it_);
    if (((this->value_).s_it_.is_end_ == true) && (((this->s_end_).is_end_ & 1U) != 0)) {
      this->is_end_ = true;
    }
    else if ((this->value_).p_it_.n_ != 0) {
      (this->value_).p_it_.is_end_ = false;
    }
  }
  return;
}

Assistant:

void increment() {
    if (++value_.p_it_ == p_end_) {
      if (++value_.s_it_ == s_end_) {
        is_end_ = true;
        return;
      } else
        value_.p_it_.reinitialize();
    }
  }